

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtMiniSDF.cpp
# Opt level: O2

bool __thiscall cbtMiniSDF::load(cbtMiniSDF *this,char *data,int size)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined1 auVar3 [64];
  cbtCell32 *pcVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [64];
  int j;
  cbtMiniSDF *pcVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  char *pcVar18;
  cbtAlignedObjectArray<double> *unaff_R12;
  cbtAlignedObjectArray<cbtCell32> *this_00;
  cbtAlignedObjectArray<double> *pcVar19;
  cbtAlignedObjectArray<unsigned_int> *this_01;
  ulong unaff_R13;
  unsigned_long_long n_cells1;
  uint i;
  cbtAlignedObjectArray<double> *pcVar20;
  bool bVar21;
  undefined1 uVar22;
  cbtScalar cVar23;
  undefined1 in_ZMM0 [64];
  undefined1 auVar24 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar25 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar26 [16];
  undefined1 in_ZMM3 [64];
  undefined1 in_register_00001304 [12];
  undefined8 local_c8;
  undefined1 local_b8 [8];
  undefined1 auStack_b0 [56];
  undefined1 local_78 [64];
  
  auVar3 = _local_b8;
  auVar24 = in_ZMM1._0_16_;
  auVar26 = in_ZMM3._0_16_;
  auVar25 = in_ZMM2._0_16_;
  if (size < 0x30) {
    uVar17 = 0;
  }
  else {
    auVar24._0_4_ = (float)*(double *)(data + 0x10);
    auVar24._4_12_ = in_ZMM0._4_12_;
    auVar25 = vcvtpd2ps_avx(*(undefined1 (*) [16])data);
    auVar26 = vcvtpd2ps_avx(*(undefined1 (*) [16])(data + 0x18));
    in_ZMM0 = ZEXT1664(CONCAT124(in_ZMM0._4_12_,(float)*(double *)(data + 0x28)));
    uVar17 = 0x30;
  }
  uVar2 = vmovlps_avx(auVar25);
  *(undefined8 *)(this->m_domain).m_min.m_floats = uVar2;
  (this->m_domain).m_min.m_floats[2] = auVar24._0_4_;
  (this->m_domain).m_min.m_floats[3] = 0.0;
  uVar2 = vmovlps_avx(auVar26);
  *(undefined8 *)(this->m_domain).m_max.m_floats = uVar2;
  (this->m_domain).m_max.m_floats[2] = in_ZMM0._0_4_;
  (this->m_domain).m_max.m_floats[3] = 0.0;
  pcVar12 = this;
  if ((int)(uVar17 | 0xc) <= size) {
    in_ZMM0 = ZEXT864(*(ulong *)(data + uVar17));
    pcVar12 = (cbtMiniSDF *)(ulong)*(uint *)(data + (ulong)uVar17 + 8);
    uVar17 = uVar17 | 0xc;
  }
  uVar2 = vmovlps_avx(in_ZMM0._0_16_);
  *(undefined8 *)this->m_resolution = uVar2;
  this->m_resolution[2] = (uint)pcVar12;
  uVar15 = uVar17 + 0x18;
  uVar16 = uVar15;
  if ((int)uVar15 <= size) {
    auVar24 = vcvtpd2ps_avx(*(undefined1 (*) [16])(data + uVar17));
    in_ZMM0 = ZEXT1664(CONCAT124(in_register_00001304,
                                 (float)*(double *)(data + (ulong)uVar17 + 0x10)));
    uVar16 = uVar17 + 0x30;
    uVar17 = uVar15;
  }
  uVar2 = vmovlps_avx(auVar24);
  *(undefined8 *)(this->m_cell_size).m_floats = uVar2;
  cVar23 = in_ZMM0._0_4_;
  (this->m_cell_size).m_floats[2] = cVar23;
  if ((int)uVar16 <= size) {
    auVar24 = vcvtpd2ps_avx(*(undefined1 (*) [16])(data + uVar17));
    cVar23 = (cbtScalar)*(double *)(data + (ulong)uVar17 + 0x10);
    uVar17 = uVar16;
  }
  uVar16 = uVar17 + 8;
  uVar2 = vmovlps_avx(auVar24);
  *(undefined8 *)(this->m_inv_cell_size).m_floats = uVar2;
  (this->m_inv_cell_size).m_floats[2] = cVar23;
  pcVar18 = data;
  if ((int)uVar16 <= size) {
    uVar15 = uVar17 + 0x10;
    pcVar18 = *(char **)(data + uVar17);
    uVar17 = uVar16;
    uVar16 = uVar15;
  }
  this->m_n_cells = (size_t)pcVar18;
  pcVar12 = this;
  if ((int)uVar16 <= size) {
    pcVar12 = *(cbtMiniSDF **)(data + uVar17);
    uVar17 = uVar16;
    uVar16 = uVar16 + 8;
  }
  this->m_n_fields = (size_t)pcVar12;
  if ((size < (int)uVar16) ||
     (unaff_R13 = *(ulong *)(data + uVar17), uVar17 = uVar16, unaff_R13 < 0x40000001)) {
    auStack_b0[0x10] = 1;
    _local_b8 = auVar3._0_16_;
    auStack_b0._8_8_ = 0;
    local_b8._0_4_ = auVar3._0_4_;
    stack0xffffffffffffff4c = 0;
    cbtAlignedObjectArray<cbtAlignedObjectArray<double>_>::resize
              (&this->m_nodes,(int)unaff_R13,(cbtAlignedObjectArray<double> *)local_b8);
    cbtAlignedObjectArray<double>::~cbtAlignedObjectArray((cbtAlignedObjectArray<double> *)local_b8)
    ;
    uVar14 = 0;
    while( true ) {
      auVar3 = _local_b8;
      uVar16 = uVar17 + 8;
      if (unaff_R13 <= uVar14) break;
      if ((int)uVar16 <= size) {
        local_c8 = *(undefined8 *)(data + (int)uVar17);
        uVar17 = uVar16;
      }
      unaff_R12 = (this->m_nodes).m_data + (int)uVar14;
      auVar11._56_8_ = 0;
      auVar11._0_56_ = auStack_b0;
      _local_b8 = auVar11 << 0x40;
      cbtAlignedObjectArray<double>::resize(unaff_R12,(int)local_c8,(double *)local_b8);
      for (lVar13 = 0; lVar13 < unaff_R12->m_size; lVar13 = lVar13 + 1) {
        if ((int)(uVar17 + 8) <= size) {
          unaff_R12->m_data[lVar13] = *(double *)(data + (int)uVar17);
          uVar17 = uVar17 + 8;
        }
      }
      uVar14 = (ulong)((int)uVar14 + 1);
    }
    if ((int)uVar16 <= size) {
      unaff_R12 = *(cbtAlignedObjectArray<double> **)(data + (int)uVar17);
      uVar17 = uVar16;
    }
    auStack_b0[0x10] = 1;
    _local_b8 = auVar3._0_16_;
    auStack_b0._8_8_ = 0;
    local_b8._0_4_ = auVar3._0_4_;
    stack0xffffffffffffff4c = 0;
    cbtAlignedObjectArray<cbtAlignedObjectArray<cbtCell32>_>::resize
              (&this->m_cells,(int)unaff_R12,(cbtAlignedObjectArray<cbtCell32> *)local_b8);
    cbtAlignedObjectArray<cbtCell32>::~cbtAlignedObjectArray
              ((cbtAlignedObjectArray<cbtCell32> *)local_b8);
    pcVar20 = (cbtAlignedObjectArray<double> *)0x0;
    while( true ) {
      auVar3 = _local_b8;
      uVar16 = uVar17 + 8;
      if (pcVar20 == unaff_R12) break;
      if ((int)uVar16 <= size) {
        unaff_R13 = *(ulong *)(data + (int)uVar17);
        uVar17 = uVar16;
      }
      _local_b8 = ZEXT1664(ZEXT816(0) << 0x40);
      this_00 = (this->m_cells).m_data + (long)pcVar20;
      local_78 = _local_b8;
      cbtAlignedObjectArray<cbtCell32>::resize(this_00,(int)unaff_R13,(cbtCell32 *)local_b8);
      lVar13 = 0;
      uVar14 = unaff_R13;
      while (bVar21 = uVar14 != 0, uVar14 = uVar14 - 1, bVar21) {
        if ((int)(uVar17 + 0x80) <= size) {
          pcVar4 = this_00->m_data;
          auVar3 = *(undefined1 (*) [64])(data + (int)uVar17);
          pcVar18 = data + (long)(int)uVar17 + 0x40;
          uVar2 = *(undefined8 *)(pcVar18 + 8);
          uVar5 = *(undefined8 *)(pcVar18 + 0x10);
          uVar6 = *(undefined8 *)(pcVar18 + 0x18);
          uVar7 = *(undefined8 *)(pcVar18 + 0x20);
          uVar8 = *(undefined8 *)(pcVar18 + 0x28);
          uVar9 = *(undefined8 *)(pcVar18 + 0x30);
          uVar10 = *(undefined8 *)(pcVar18 + 0x38);
          puVar1 = (undefined8 *)((long)pcVar4->m_cells + lVar13 + 0x40);
          *puVar1 = *(undefined8 *)pcVar18;
          puVar1[1] = uVar2;
          puVar1[2] = uVar5;
          puVar1[3] = uVar6;
          puVar1[4] = uVar7;
          puVar1[5] = uVar8;
          puVar1[6] = uVar9;
          puVar1[7] = uVar10;
          *(undefined1 (*) [64])((long)pcVar4->m_cells + lVar13) = auVar3;
          uVar17 = uVar17 + 0x80;
        }
        lVar13 = lVar13 + 0x80;
      }
      pcVar20 = (cbtAlignedObjectArray<double> *)&pcVar20->field_0x1;
    }
    if ((int)uVar16 <= size) {
      pcVar20 = *(cbtAlignedObjectArray<double> **)(data + (int)uVar17);
      uVar17 = uVar16;
    }
    auStack_b0[0x10] = 1;
    _local_b8 = auVar3._0_16_;
    auStack_b0._8_8_ = 0;
    local_b8._0_4_ = auVar3._0_4_;
    stack0xffffffffffffff4c = 0;
    cbtAlignedObjectArray<cbtAlignedObjectArray<unsigned_int>_>::resize
              (&this->m_cell_map,(int)pcVar20,(cbtAlignedObjectArray<unsigned_int> *)local_b8);
    cbtAlignedObjectArray<unsigned_int>::~cbtAlignedObjectArray
              ((cbtAlignedObjectArray<unsigned_int> *)local_b8);
    for (pcVar19 = (cbtAlignedObjectArray<double> *)0x0; pcVar19 != pcVar20;
        pcVar19 = (cbtAlignedObjectArray<double> *)&pcVar19->field_0x1) {
      if ((int)(uVar17 + 8) <= size) {
        unaff_R13 = *(ulong *)(data + (int)uVar17);
        uVar17 = uVar17 + 8;
      }
      this_01 = (this->m_cell_map).m_data + (long)pcVar19;
      auVar3._60_4_ = 0;
      auVar3._0_60_ = stack0xffffffffffffff4c;
      _local_b8 = auVar3 << 0x20;
      cbtAlignedObjectArray<unsigned_int>::resize(this_01,(int)unaff_R13,(uint *)local_b8);
      for (uVar14 = 0; unaff_R13 != uVar14; uVar14 = uVar14 + 1) {
        if ((int)(uVar17 + 4) <= size) {
          this_01->m_data[uVar14] = *(uint *)(data + (int)uVar17);
          uVar17 = uVar17 + 4;
        }
      }
    }
    uVar22 = uVar17 == size;
    this->m_isValid = (bool)uVar22;
  }
  else {
    uVar22 = this->m_isValid;
  }
  return (bool)uVar22;
}

Assistant:

bool cbtMiniSDF::load(const char* data, int size)
{
	int fileSize = -1;

	cbtSdfDataStream ds(data, size);
	{
		double buf[6];
		ds.read(buf);
		m_domain.m_min[0] = buf[0];
		m_domain.m_min[1] = buf[1];
		m_domain.m_min[2] = buf[2];
		m_domain.m_min[3] = 0;
		m_domain.m_max[0] = buf[3];
		m_domain.m_max[1] = buf[4];
		m_domain.m_max[2] = buf[5];
		m_domain.m_max[3] = 0;
	}
	{
		unsigned int buf2[3];
		ds.read(buf2);
		m_resolution[0] = buf2[0];
		m_resolution[1] = buf2[1];
		m_resolution[2] = buf2[2];
	}
	{
		double buf[3];
		ds.read(buf);
		m_cell_size[0] = buf[0];
		m_cell_size[1] = buf[1];
		m_cell_size[2] = buf[2];
	}
	{
		double buf[3];
		ds.read(buf);
		m_inv_cell_size[0] = buf[0];
		m_inv_cell_size[1] = buf[1];
		m_inv_cell_size[2] = buf[2];
	}
	{
		unsigned long long int cells;
		ds.read(cells);
		m_n_cells = cells;
	}
	{
		unsigned long long int fields;
		ds.read(fields);
		m_n_fields = fields;
	}

	unsigned long long int nodes0;
	std::size_t n_nodes0;
	ds.read(nodes0);
	n_nodes0 = nodes0;
	if (n_nodes0 > 1024 * 1024 * 1024)
	{
		return m_isValid;
	}
	m_nodes.resize(n_nodes0);
	for (unsigned int i = 0; i < n_nodes0; i++)
	{
		unsigned long long int n_nodes1;
		ds.read(n_nodes1);
		cbtAlignedObjectArray<double>& nodes = m_nodes[i];
		nodes.resize(n_nodes1);
		for (int j = 0; j < nodes.size(); j++)
		{
			double& node = nodes[j];
			ds.read(node);
		}
	}

	unsigned long long int n_cells0;
	ds.read(n_cells0);
	m_cells.resize(n_cells0);
	for (int i = 0; i < n_cells0; i++)
	{
		unsigned long long int n_cells1;
		cbtAlignedObjectArray<cbtCell32>& cells = m_cells[i];
		ds.read(n_cells1);
		cells.resize(n_cells1);
		for (int j = 0; j < n_cells1; j++)
		{
			cbtCell32& cell = cells[j];
			ds.read(cell);
		}
	}

	{
		unsigned long long int n_cell_maps0;
		ds.read(n_cell_maps0);

		m_cell_map.resize(n_cell_maps0);
		for (int i = 0; i < n_cell_maps0; i++)
		{
			unsigned long long int n_cell_maps1;
			cbtAlignedObjectArray<unsigned int>& cell_maps = m_cell_map[i];
			ds.read(n_cell_maps1);
			cell_maps.resize(n_cell_maps1);
			for (int j = 0; j < n_cell_maps1; j++)
			{
				unsigned int& cell_map = cell_maps[j];
				ds.read(cell_map);
			}
		}
	}

	m_isValid = (ds.m_currentOffset == ds.m_size);
	return m_isValid;
}